

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_platform_posix.c
# Opt level: O0

PHYSFS_Io * doOpen(void *opaque,char *name,int mode)

{
  undefined1 *ptr;
  char *path;
  int errcode;
  size_t sVar1;
  ulong len_00;
  char *buf;
  char *pcVar2;
  undefined1 **ppuVar3;
  undefined1 *local_98;
  size_t local_90;
  char *local_88;
  char *local_80;
  size_t local_78;
  undefined1 local_70 [8];
  PHYSFS_Stat statbuf;
  PHYSFS_ErrorCode err;
  size_t len;
  char *f;
  PHYSFS_Io *io;
  int mode_local;
  char *name_local;
  void *opaque_local;
  
  ppuVar3 = &local_98;
  if (opaque == (void *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = strlen((char *)opaque);
  }
  local_90 = local_78;
  sVar1 = strlen(name);
  len_00 = local_90 + sVar1 + 1;
  if (len_00 < 0x100) {
    ppuVar3 = (undefined1 **)((long)&local_98 - (local_90 + sVar1 + 0x18 & 0xfffffffffffffff0));
    local_98 = (undefined1 *)ppuVar3;
  }
  else {
    local_98 = (undefined1 *)0x0;
  }
  ptr = local_98;
  local_88 = (char *)opaque;
  local_80 = name;
  *(undefined8 *)((long)ppuVar3 + -8) = 0x111900;
  buf = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
  path = local_80;
  pcVar2 = local_88;
  *(undefined8 *)((long)ppuVar3 + -8) = 0x111914;
  pcVar2 = cvtToDependent(pcVar2,path,buf,len_00);
  if (pcVar2 == (char *)0x0) {
    opaque_local = (void *)0x0;
  }
  else {
    *(undefined8 *)((long)ppuVar3 + -8) = 0x111937;
    opaque_local = __PHYSFS_createNativeIo(pcVar2,mode);
    if ((PHYSFS_Io *)opaque_local == (PHYSFS_Io *)0x0) {
      *(undefined8 *)((long)ppuVar3 + -8) = 0x111947;
      statbuf.readonly = PHYSFS_getLastErrorCode();
      *(undefined8 *)((long)ppuVar3 + -8) = 0x111959;
      __PHYSFS_platformStat(pcVar2,(PHYSFS_Stat *)local_70,0);
      errcode = statbuf.readonly;
      *(undefined8 *)((long)ppuVar3 + -8) = 0x111961;
      PHYSFS_setErrorCode(errcode);
    }
    *(undefined8 *)((long)ppuVar3 + -8) = 0x11196a;
    __PHYSFS_smallFree(pcVar2);
  }
  return (PHYSFS_Io *)opaque_local;
}

Assistant:

static void *doOpen(const char *filename, int mode)
{
    const int appending = (mode & O_APPEND);
    int fd;
    int *retval;

    errno = 0;

    /* O_APPEND doesn't actually behave as we'd like. */
    mode &= ~O_APPEND;

#ifdef O_CLOEXEC
    /* Add O_CLOEXEC if defined */
    mode |= O_CLOEXEC;
#endif

    do {
        fd = open(filename, mode, S_IRUSR | S_IWUSR);
    } while ((fd < 0) && (errno == EINTR));
    BAIL_IF(fd < 0, errcodeFromErrno(), NULL);

#if !defined(O_CLOEXEC) && defined(FD_CLOEXEC)
    set_CLOEXEC(fd);
#endif

    if (appending)
    {
        if (lseek(fd, 0, SEEK_END) < 0)
        {
            const int err = errno;
            close(fd);
            BAIL(errcodeFromErrnoError(err), NULL);
        } /* if */
    } /* if */

    retval = (int *) allocator.Malloc(sizeof (int));
    if (!retval)
    {
        close(fd);
        BAIL(PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    } /* if */

    *retval = fd;
    return ((void *) retval);
}